

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIAggregator.cpp
# Opt level: O2

void __thiscall adios2::aggregator::MPIAggregator::Close(MPIAggregator *this)

{
  allocator local_31;
  string local_30;
  
  if (this->m_IsActive == true) {
    std::__cxx11::string::string
              ((string *)&local_30,"freeing aggregators comm at Close\n",&local_31);
    helper::Comm::Free(&this->m_Comm,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    this->m_IsActive = false;
  }
  return;
}

Assistant:

void MPIAggregator::Close()
{
    if (m_IsActive)
    {
        m_Comm.Free("freeing aggregators comm at Close\n");
        m_IsActive = false;
    }
}